

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::update_torrent_info_hash
          (session_impl *this,shared_ptr<libtorrent::aux::torrent> *t,info_hash_t *old_ih)

{
  element_type *peVar1;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  torrent_list<libtorrent::aux::torrent>::erase(&this->m_torrents,old_ih);
  peVar1 = (t->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&t->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)
  ;
  torrent_list<libtorrent::aux::torrent>::insert
            (&this->m_torrents,&peVar1->m_info_hash,
             (shared_ptr<libtorrent::aux::torrent> *)&local_30);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

void session_impl::update_torrent_info_hash(std::shared_ptr<torrent> const& t
		, info_hash_t const& old_ih)
	{
		m_torrents.erase(old_ih);
		m_torrents.insert(t->info_hash(), t);
	}